

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::ResourceDefinition::StructMember::~StructMember
          (StructMember *this)

{
  Node::~Node(&this->super_Node);
  operator_delete(this,0x20);
  return;
}

Assistant:

StructMember (const SharedPtr& enclosing)
		: Node(TYPE_STRUCT_MEMBER, enclosing)
	{
		DE_ASSERT(enclosing->getType() == TYPE_STORAGE_QUALIFIER		||
				  enclosing->getType() == TYPE_LAYOUT_QUALIFIER			||
				  enclosing->getType() == TYPE_INTERPOLATION_QUALIFIER	||
				  enclosing->getType() == TYPE_INTERFACE_BLOCK			||
				  enclosing->getType() == TYPE_ARRAY_ELEMENT			||
				  enclosing->getType() == TYPE_STRUCT_MEMBER			||
				  enclosing->getType() == TYPE_TRANSFORM_FEEDBACK_TARGET);
	}